

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc.c
# Opt level: O0

int Disto16x16_C(uint8_t *a,uint8_t *b,uint16_t *w)

{
  int iVar1;
  uint8_t *in_RDX;
  uint8_t *in_RSI;
  int y;
  int x;
  int D;
  undefined4 local_24;
  int iVar2;
  int iVar3;
  
  iVar3 = 0;
  for (local_24 = 0; local_24 < 0x200; local_24 = local_24 + 0x80) {
    for (iVar2 = 0; iVar2 < 0x10; iVar2 = iVar2 + 4) {
      iVar1 = Disto4x4_C(in_RSI,in_RDX,(uint16_t *)CONCAT44(iVar3,iVar2));
      iVar3 = iVar1 + iVar3;
    }
  }
  return iVar3;
}

Assistant:

static int Disto16x16_C(const uint8_t* const a, const uint8_t* const b,
                        const uint16_t* const w) {
  int D = 0;
  int x, y;
  for (y = 0; y < 16 * BPS; y += 4 * BPS) {
    for (x = 0; x < 16; x += 4) {
      D += Disto4x4_C(a + x + y, b + x + y, w);
    }
  }
  return D;
}